

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  char *pcVar2;
  bool bVar3;
  char *__s;
  string local_50;
  
  this_00 = this->Makefile;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CMAKE_PLATFORM_HAS_INSTALLNAME","");
  bVar3 = cmMakefile::IsOn(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar3) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"INSTALL_NAME_DIR","");
    __s = GetProperty(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar3 = CanGenerateInstallNameDir(this,INSTALL_NAME_FOR_INSTALL);
    if ((bVar3 && __s != (char *)0x0) && (*__s != '\0')) {
      pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)__s);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (__s == (char *)0x0) {
      bVar3 = MacOSXRpathInstallNameDirDefault(this);
      if (bVar3) {
        std::__cxx11::string::_M_replace
                  ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                   0x56f5f5);
      }
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetInstallNameDirForInstallTree() const
{
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    std::string dir;
    const char* install_name_dir = this->GetProperty("INSTALL_NAME_DIR");

    if (this->CanGenerateInstallNameDir(INSTALL_NAME_FOR_INSTALL)) {
      if (install_name_dir && *install_name_dir) {
        dir = install_name_dir;
        dir += "/";
      }
    }
    if (!install_name_dir) {
      if (this->MacOSXRpathInstallNameDirDefault()) {
        dir = "@rpath/";
      }
    }
    return dir;
  }
  return "";
}